

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::PeekAndCheckType(TypeChecker *this,Index depth,Type expected)

{
  Result RVar1;
  Type actual;
  Type local_18;
  
  local_18.enum_ = Any;
  local_18.type_index_ = 0;
  RVar1 = PeekType(this,depth,&local_18);
  RVar1.enum_._0_1_ =
       RVar1.enum_ == Error ||
       local_18 != expected && (local_18.enum_ != Any && expected.enum_ != Any);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::PeekAndCheckType(Index depth, Type expected) {
  Type actual = Type::Any;
  Result result = PeekType(depth, &actual);
  return result | CheckType(actual, expected);
}